

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O0

void multi_kv_rollback_test(uint8_t opt,size_t chunksize)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  byte in_DIL;
  fdb_custom_cmp_variable functions [3];
  char *kvs_names [3];
  fdb_status s;
  fdb_doc *doc;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_seqnum_t seq3;
  fdb_seqnum_t seq2;
  fdb_seqnum_t seq1;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char valuestr [14];
  char keystr [8];
  char value [256];
  char key [256];
  int r;
  int i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffff938;
  fdb_seqnum_t *in_stack_fffffffffffff940;
  fdb_kvs_handle *in_stack_fffffffffffff948;
  undefined1 *in_stack_fffffffffffff950;
  fdb_doc **in_stack_fffffffffffff958;
  fdb_doc **doc_00;
  undefined1 *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffffa60;
  fdb_kvs_handle **in_stack_fffffffffffffa68;
  fdb_kvs_config *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  fdb_kvs_handle **in_stack_fffffffffffffaf0;
  fdb_file_handle *in_stack_fffffffffffffaf8;
  fdb_custom_cmp_variable *in_stack_fffffffffffffb50;
  fdb_config *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  fdb_config *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffb70;
  fdb_file_handle **in_stack_fffffffffffffb78;
  void **in_stack_fffffffffffffb90;
  fdb_status local_3e4;
  fdb_doc *local_3e0;
  undefined1 local_3c0 [8];
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a0;
  undefined1 local_380;
  undefined8 local_308;
  fdb_kvs_handle *local_2b0;
  fdb_kvs_handle *local_2a8;
  fdb_kvs_handle *local_2a0;
  char local_28e [14];
  char local_280 [8];
  char local_278 [256];
  undefined1 local_178 [352];
  size_t local_18;
  byte local_1;
  
  local_1 = in_DIL;
  gettimeofday((timeval *)(local_178 + 0x158),(__timezone_ptr_t)0x0);
  local_178._312_8_ = local_178._344_8_;
  local_178._320_8_ = local_18;
  local_178._276_4_ = 100;
  builtin_strncpy(local_280,"key%06d",8);
  builtin_strncpy(local_28e,"value%08d(%s)",0xe);
  sprintf(local_278,"rm -rf  multi_kv_test*");
  local_178._268_4_ = system(local_278);
  memleak_start();
  fdb_get_default_config();
  memcpy(local_3c0,&stack0xfffffffffffffae0,0xf8);
  fdb_get_default_kvs_config();
  local_3a0 = 1;
  local_380 = 1;
  local_3b0 = 1000;
  local_3b8 = 0;
  local_308 = 0;
  if ((local_1 & 1) == 0) {
    fVar1 = fdb_open((fdb_file_handle **)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
                     in_stack_fffffffffffffb58);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x5ff);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x5ff,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
  }
  else {
    in_stack_fffffffffffff938 = (fdb_kvs_handle *)0x0;
    fVar1 = fdb_open_custom_cmp(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                                in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                                (char **)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                                in_stack_fffffffffffffb90);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x5fc);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x5fc,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8
                       ,in_stack_fffffffffffffae0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x602);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x602,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8
                       ,in_stack_fffffffffffffae0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x604);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x604,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar1 = fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8
                       ,in_stack_fffffffffffffae0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x606);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x606,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  for (local_178._272_4_ = 0; (int)local_178._272_4_ < (int)local_178._276_4_;
      local_178._272_4_ = local_178._272_4_ + 1) {
    sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit1)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x114eb4,(size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_set(local_2a0,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x60e);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x60e,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x114f42);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit1)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x114fe2,(size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2a8,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x613);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x613,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0xf == 0) {
      local_3e4 = fdb_set(local_2a8,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x615);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x615,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x115105);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit1)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    in_stack_fffffffffffff938 = (fdb_kvs_handle *)(sVar3 + 1);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,(void *)0x1151a5,
                   (size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2b0,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x61a);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x61a,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0x1b == 0) {
      local_3e4 = fdb_set(local_2b0,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x61c);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x61c,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x1152c8);
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff938,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x620);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x620,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar1 = fdb_get_kvs_seqnum(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x622);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x622,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  for (local_178._272_4_ = 0; (int)local_178._272_4_ < (int)local_178._276_4_;
      local_178._272_4_ = local_178._272_4_ + 1) {
    sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit2)");
    in_stack_fffffffffffffa68 = (fdb_kvs_handle **)local_178;
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x1154ba,(size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_set(local_2a0,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x62a);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x62a,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x115548);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit2)");
    strlen(local_178);
    in_stack_fffffffffffffa60 = local_278;
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x1155e8,(size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2a8,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x62f);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x62f,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0xf == 0) {
      local_3e4 = fdb_set(local_2a8,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x631);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x631,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x11570b);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit2)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    in_stack_fffffffffffff938 = (fdb_kvs_handle *)(sVar3 + 1);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,(void *)0x1157ab,
                   (size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2b0,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x636);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x636,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0x1b == 0) {
      local_3e4 = fdb_set(local_2b0,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x638);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x638,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x1158ce);
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff938,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x63c);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x63c,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar1 = fdb_get_kvs_seqnum(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x63e);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x63e,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  for (local_178._272_4_ = 0; (int)local_178._272_4_ < (int)local_178._276_4_;
      local_178._272_4_ = local_178._272_4_ + 1) {
    sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit3)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x115ac0,(size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_set(local_2a0,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x646);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x646,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x115b4e);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit3)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x115bee,(size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2a8,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x64b);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x64b,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0xf == 0) {
      local_3e4 = fdb_set(local_2a8,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x64d);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x64d,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x115d11);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit3)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    in_stack_fffffffffffff938 = (fdb_kvs_handle *)(sVar3 + 1);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,(void *)0x115db1,
                   (size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2b0,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x652);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x652,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0x1b == 0) {
      local_3e4 = fdb_set(local_2b0,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x654);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x654,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x115ed4);
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff938,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x658);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x658,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar1 = fdb_get_kvs_seqnum(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x65a);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x65a,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  for (local_178._272_4_ = 0; (int)local_178._272_4_ < (int)local_178._276_4_;
      local_178._272_4_ = local_178._272_4_ + 1) {
    sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit4)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x1160c3,(size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_set(local_2a0,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x662);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x662,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x116151);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit4)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,sVar3 + 1,
                   (void *)0x1161f1,(size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2a8,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x667);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x667,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0xf == 0) {
      local_3e4 = fdb_set(local_2a8,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x669);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x669,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x116314);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit4)");
    strlen(local_178);
    sVar3 = strlen(local_278);
    in_stack_fffffffffffff938 = (fdb_kvs_handle *)(sVar3 + 1);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                   (size_t)in_stack_fffffffffffff938,(void *)0x1163a8,
                   (size_t)in_stack_fffffffffffff970);
    local_3e4 = fdb_set(local_2b0,local_3e0);
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x66e);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x66e,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    if ((int)local_178._272_4_ % 0x1b == 0) {
      local_3e4 = fdb_set(local_2b0,local_3e0);
    }
    if (local_3e4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x670);
      multi_kv_rollback_test::__test_pass = 0;
      if (local_3e4 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x670,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x1164cb);
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff938,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x674);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x674,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar1 = fdb_rollback(in_stack_fffffffffffffa68,(fdb_seqnum_t)in_stack_fffffffffffffa60);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x678);
    multi_kv_rollback_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x678,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  local_178._272_4_ = 0;
  while( true ) {
    if ((int)local_178._276_4_ <= (int)local_178._272_4_) {
      fVar1 = fdb_rollback(in_stack_fffffffffffffa68,(fdb_seqnum_t)in_stack_fffffffffffffa60);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x693);
        multi_kv_rollback_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x693,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
      }
      local_178._272_4_ = 0;
      while( true ) {
        if ((int)local_178._276_4_ <= (int)local_178._272_4_) {
          fVar1 = fdb_rollback(in_stack_fffffffffffffa68,(fdb_seqnum_t)in_stack_fffffffffffffa60);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x6ae);
            multi_kv_rollback_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x6ae,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
          }
          local_178._272_4_ = 0;
          while( true ) {
            if ((int)local_178._276_4_ <= (int)local_178._272_4_) {
              fVar1 = fdb_kvs_close(in_stack_fffffffffffff938);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x6c9);
                multi_kv_rollback_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x6c9,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
              }
              fVar1 = fdb_kvs_close(in_stack_fffffffffffff938);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x6cb);
                multi_kv_rollback_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x6cb,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
              }
              fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffff938);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x6cd);
                multi_kv_rollback_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x6cd,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
              }
              if ((local_1 & 1) == 0) {
                local_3e4 = fdb_open((fdb_file_handle **)in_stack_fffffffffffffb68,
                                     in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
                if (local_3e4 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6d5);
                  multi_kv_rollback_test::__test_pass = 0;
                  if (local_3e4 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6d5,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
              }
              else {
                in_stack_fffffffffffff938 = (fdb_kvs_handle *)0x0;
                local_3e4 = fdb_open_custom_cmp(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                                                in_stack_fffffffffffffb68,
                                                (size_t)in_stack_fffffffffffffb60,
                                                (char **)in_stack_fffffffffffffb58,
                                                in_stack_fffffffffffffb50,in_stack_fffffffffffffb90)
                ;
                if (local_3e4 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6d2);
                  multi_kv_rollback_test::__test_pass = 0;
                  if (local_3e4 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6d2,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
              }
              if (local_3e4 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x6d7);
                multi_kv_rollback_test::__test_pass = 0;
                if (local_3e4 != FDB_RESULT_SUCCESS) {
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x6d7,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
              }
              fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                           in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
              fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                           in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
              fdb_kvs_open(in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                           in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
              local_178._272_4_ = 0;
              while( true ) {
                if ((int)local_178._276_4_ <= (int)local_178._272_4_) {
                  fdb_kvs_close(in_stack_fffffffffffff938);
                  fdb_kvs_close(in_stack_fffffffffffff938);
                  fdb_close((fdb_file_handle *)in_stack_fffffffffffff938);
                  fdb_shutdown();
                  memleak_end();
                  if ((local_1 & 1) == 0) {
                    if (multi_kv_rollback_test::__test_pass == 0) {
                      fprintf(_stderr,"%s FAILED\n","multiple KV instances rollback test");
                    }
                    else {
                      fprintf(_stderr,"%s PASSED\n","multiple KV instances rollback test");
                    }
                  }
                  else if (multi_kv_rollback_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n",
                            "multiple KV instances rollback test (custom key order)");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n",
                            "multiple KV instances rollback test (custom key order)");
                  }
                  return;
                }
                sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
                sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit2)");
                doc_00 = (fdb_doc **)local_178;
                strlen(local_178);
                fdb_doc_create(doc_00,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948,
                               in_stack_fffffffffffff940,0,(void *)0x1179b0,
                               (size_t)in_stack_fffffffffffff970);
                fVar1 = fdb_get(local_2a0,local_3e0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6e2);
                  multi_kv_rollback_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6e2,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
                iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,
                          local_278,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6e3);
                  multi_kv_rollback_test::__test_pass = 0;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x6e3,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
                fdb_doc_free((fdb_doc *)0x117aca);
                sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit1)");
                in_stack_fffffffffffff950 = local_178;
                strlen(local_178);
                fdb_doc_create(doc_00,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948,
                               in_stack_fffffffffffff940,0,(void *)0x117b35,
                               (size_t)in_stack_fffffffffffff970);
                fVar1 = fdb_get(local_2a8,local_3e0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6e8);
                  multi_kv_rollback_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6e8,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
                iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
                if (iVar2 != 0) break;
                fdb_doc_free((fdb_doc *)0x117c4f);
                sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit3)");
                in_stack_fffffffffffff948 = (fdb_kvs_handle *)local_178;
                strlen(local_178);
                in_stack_fffffffffffff938 = (fdb_kvs_handle *)0x0;
                fdb_doc_create(doc_00,in_stack_fffffffffffff950,(size_t)in_stack_fffffffffffff948,
                               in_stack_fffffffffffff940,0,(void *)0x117cba,
                               (size_t)in_stack_fffffffffffff970);
                fVar1 = fdb_get(local_2b0,local_3e0);
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6ee);
                  multi_kv_rollback_test::__test_pass = 0;
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6ee,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
                iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
                if (iVar2 != 0) {
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,
                          local_278,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6ef);
                  multi_kv_rollback_test::__test_pass = 0;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x6ef,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
                fdb_doc_free((fdb_doc *)0x117dd4);
                local_178._272_4_ = local_178._272_4_ + 1;
              }
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,
                      local_278,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x6e9);
              multi_kv_rollback_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x6e9,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
            sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
            sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit2)");
            in_stack_fffffffffffff970 = local_178;
            strlen(local_178);
            fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                           (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,
                           (void *)0x11714b,(size_t)in_stack_fffffffffffff970);
            fVar1 = fdb_get(local_2a0,local_3e0);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x6b6);
              multi_kv_rollback_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x6b6,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
            }
            iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,
                      local_278,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x6b7);
              multi_kv_rollback_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x6b7,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
            fdb_doc_free((fdb_doc *)0x117265);
            sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit1)");
            strlen(local_178);
            fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                           (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,
                           (void *)0x1172d0,(size_t)in_stack_fffffffffffff970);
            fVar1 = fdb_get(local_2a8,local_3e0);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x6bc);
              multi_kv_rollback_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x6bc,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
            }
            iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
            if (iVar2 != 0) {
              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,
                      local_278,
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x6bd);
              multi_kv_rollback_test::__test_pass = 0;
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x6bd,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
            fdb_doc_free((fdb_doc *)0x1173ea);
            sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit3)");
            strlen(local_178);
            in_stack_fffffffffffff938 = (fdb_kvs_handle *)0x0;
            fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                           (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,
                           (void *)0x117455,(size_t)in_stack_fffffffffffff970);
            fVar1 = fdb_get(local_2b0,local_3e0);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x6c2);
              multi_kv_rollback_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x6c2,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
            }
            iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
            if (iVar2 != 0) break;
            fdb_doc_free((fdb_doc *)0x11756f);
            local_178._272_4_ = local_178._272_4_ + 1;
          }
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x6c3);
          multi_kv_rollback_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x6c3,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
        sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
        sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit2)");
        strlen(local_178);
        fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,
                       (void *)0x116be8,(size_t)in_stack_fffffffffffff970);
        fVar1 = fdb_get(local_2a0,local_3e0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x69b);
          multi_kv_rollback_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x69b,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
        }
        iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x69c);
          multi_kv_rollback_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x69c,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
        fdb_doc_free((fdb_doc *)0x116d02);
        sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit1)");
        strlen(local_178);
        fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,
                       (void *)0x116d6d,(size_t)in_stack_fffffffffffff970);
        fVar1 = fdb_get(local_2a8,local_3e0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x6a1);
          multi_kv_rollback_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6a1,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
        }
        iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
        if (iVar2 != 0) break;
        fdb_doc_free((fdb_doc *)0x116e87);
        sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit4)");
        strlen(local_178);
        in_stack_fffffffffffff938 = (fdb_kvs_handle *)0x0;
        fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,
                       (void *)0x116ef2,(size_t)in_stack_fffffffffffff970);
        fVar1 = fdb_get(local_2b0,local_3e0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x6a7);
          multi_kv_rollback_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x6a7,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
        }
        iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
        if (iVar2 != 0) {
          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x6a8);
          multi_kv_rollback_test::__test_pass = 0;
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x6a8,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
        fdb_doc_free((fdb_doc *)0x11700c);
        local_178._272_4_ = local_178._272_4_ + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x6a2);
      multi_kv_rollback_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x6a2,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
    sprintf(local_178,local_280,(ulong)(uint)local_178._272_4_);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"default(commit4)");
    strlen(local_178);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,(void *)0x116685,
                   (size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_get(local_2a0,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x680);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x680,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x681);
      multi_kv_rollback_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x681,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
    fdb_doc_free((fdb_doc *)0x11679f);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv1(commit1)");
    strlen(local_178);
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,(void *)0x11680a,
                   (size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_get(local_2a8,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x686);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x686,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
    if (iVar2 != 0) break;
    fdb_doc_free((fdb_doc *)0x116924);
    sprintf(local_278,local_28e,(ulong)(uint)local_178._272_4_,"kv2(commit4)");
    strlen(local_178);
    in_stack_fffffffffffff938 = (fdb_kvs_handle *)0x0;
    fdb_doc_create(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                   (size_t)in_stack_fffffffffffff948,in_stack_fffffffffffff940,0,(void *)0x11698f,
                   (size_t)in_stack_fffffffffffff970);
    fVar1 = fdb_get(local_2b0,local_3e0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x68c);
      multi_kv_rollback_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x68c,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    iVar2 = memcmp(local_278,local_3e0->body,local_3e0->bodylen);
    if (iVar2 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x68d);
      multi_kv_rollback_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x68d,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
    fdb_doc_free((fdb_doc *)0x116aa9);
    local_178._272_4_ = local_178._272_4_ + 1;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_3e0->body,local_278,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
          ,0x687);
  multi_kv_rollback_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x687,"void multi_kv_rollback_test(uint8_t, size_t)");
}

Assistant:

void multi_kv_rollback_test(uint8_t opt, size_t chunksize)
{
    TEST_INIT();

    int n = 100;
    int i, r;
    char key[256], value[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_seqnum_t seq1, seq2, seq3;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s;

    char *kvs_names[] = {NULL, (char*)"kv1", (char*)"kv2"};
    fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp};

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.chunksize = chunksize;
    config.multi_kv_instances = true;
    config.wal_threshold = 1000;
    config.buffercache_size = 0;
    // for rollback, disable block reusing
    config.block_reusing_threshold = 0;

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents first time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv1, &seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents second time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(db, &seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv2, &seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // rollback kv1 using seq1
    s = fdb_rollback(&kv1, seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq2
    s = fdb_rollback(&db, seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq3
    s = fdb_rollback(&kv2, seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & re-open
    s = fdb_kvs_close(kv1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(kv2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);

    // retrieve check after re-open
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();

    if (opt & MULTI_KV_VAR_CMP) {
        TEST_RESULT("multiple KV instances rollback test "
                    "(custom key order)");
    } else {
        TEST_RESULT("multiple KV instances rollback test");
    }
}